

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_legacy_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t param_2)

{
  uint32_t id;
  CompilerError *this_00;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string res;
  SPIRType *imagetype;
  uint32_t param_2_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->image);
  res.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  ::std::__cxx11::string::string((string *)local_50);
  if (*(int *)(res.field_2._8_8_ + 0x10) == 7) {
    ::std::__cxx11::string::operator=((string *)local_50,"i");
  }
  else if (*(int *)(res.field_2._8_8_ + 0x10) == 8) {
    ::std::__cxx11::string::operator=((string *)local_50,"u");
  }
  if ((type->basetype == Image) && ((type->image).dim == DimSubpassData)) {
    ::std::operator+(&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "subpassInput");
    pcVar1 = "";
    if (((type->image).ms & 1U) != 0) {
      pcVar1 = "MS";
    }
    ::std::operator+(__return_storage_ptr__,&local_80,pcVar1);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    if ((type->basetype == Image) && ((type->image).dim != DimSubpassData)) {
      if (((type->image).dim == DimBuffer) && ((type->image).sampled == 1)) {
        ::std::__cxx11::string::operator+=((string *)local_50,"sampler");
      }
      else {
        pcVar1 = "texture";
        if ((type->image).sampled == 2) {
          pcVar1 = "image";
        }
        ::std::__cxx11::string::operator+=((string *)local_50,pcVar1);
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)local_50,"sampler");
    }
    switch((type->image).dim) {
    case Dim1D:
      ::std::__cxx11::string::operator+=((string *)local_50,"1D");
      break;
    case Dim2D:
      ::std::__cxx11::string::operator+=((string *)local_50,"2D");
      break;
    case Dim3D:
      ::std::__cxx11::string::operator+=((string *)local_50,"3D");
      break;
    case DimCube:
      ::std::__cxx11::string::operator+=((string *)local_50,"CUBE");
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    case DimBuffer:
      ::std::__cxx11::string::operator+=((string *)local_50,"Buffer");
      break;
    case DimSubpassData:
      ::std::__cxx11::string::operator+=((string *)local_50,"2D");
    }
    if (((type->image).ms & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)local_50,"MS");
    }
    if (((type->image).arrayed & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)local_50,"Array");
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_50);
  }
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::image_type_hlsl_legacy(const SPIRType &type, uint32_t /*id*/)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
		res = "i";
		break;
	case SPIRType::UInt:
		res = "u";
		break;
	default:
		break;
	}

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		res += "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "CUBE";
		break;

	case DimBuffer:
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
		res += "Array";

	return res;
}